

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash2012.c
# Opt level: O0

void gost2012_finish_hash(gost2012_hash_ctx *CTX,uchar *digest)

{
  undefined8 *in_RSI;
  long in_RDI;
  
  stage3((gost2012_hash_ctx *)0x121bd8);
  *(undefined8 *)(in_RDI + 0x100) = 0;
  if (*(int *)(in_RDI + 0x108) == 0x100) {
    *in_RSI = *(undefined8 *)(in_RDI + 0x60);
    in_RSI[1] = *(undefined8 *)(in_RDI + 0x68);
    in_RSI[2] = *(undefined8 *)(in_RDI + 0x70);
    in_RSI[3] = *(undefined8 *)(in_RDI + 0x78);
  }
  else {
    memcpy(in_RSI,(void *)(in_RDI + 0x40),0x40);
  }
  return;
}

Assistant:

void gost2012_finish_hash(gost2012_hash_ctx * CTX, unsigned char *digest)
{
    stage3(CTX);

    CTX->bufsize = 0;

    if (CTX->digest_size == 256)
        memcpy(digest, &(CTX->h.QWORD[4]), 32);
    else
        memcpy(digest, &(CTX->h.QWORD[0]), 64);
}